

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O0

void __thiscall
kj::CidrRange::CidrRange
          (CidrRange *this,int family,ArrayPtr<const_unsigned_char> bits,uint bitCount)

{
  bool bVar1;
  size_t sVar2;
  uchar *__src;
  ulong __n;
  size_t byteCount;
  Fault f_2;
  DebugExpression<unsigned_long> local_e8;
  undefined1 local_e0 [8];
  DebugComparison<unsigned_long,_unsigned_int_&> _kjCondition_2;
  Fault f_1;
  uint *local_a8;
  undefined1 local_a0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_1;
  Fault local_68;
  Fault f;
  uint *local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint bitCount_local;
  int family_local;
  CidrRange *this_local;
  ArrayPtr<const_unsigned_char> bits_local;
  
  bits_local.ptr = (uchar *)bits.size_;
  this_local = (CidrRange *)bits.ptr;
  this->family = family;
  this->bitCount = bitCount;
  _kjCondition._32_4_ = bitCount;
  _kjCondition._36_4_ = family;
  if (family == 2) {
    local_58 = (uint *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                  (uint *)&_kjCondition.result);
    f.exception._4_4_ = 0x20;
    kj::_::DebugExpression<unsigned_int&>::operator<=
              ((DebugComparison<unsigned_int_&,_int> *)local_50,
               (DebugExpression<unsigned_int&> *)&local_58,(int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x4a,FAILED,"bitCount <= 32","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)local_50);
      kj::_::Debug::Fault::fatal(&local_68);
    }
  }
  else {
    local_a8 = (uint *)kj::_::DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                  (uint *)&_kjCondition.result);
    f_1.exception._4_4_ = 0x80;
    kj::_::DebugExpression<unsigned_int&>::operator<=
              ((DebugComparison<unsigned_int_&,_int> *)local_a0,
               (DebugExpression<unsigned_int&> *)&local_a8,(int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                ((Fault *)&_kjCondition_2.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x4c,FAILED,"bitCount <= 128","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)local_a0);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
    }
  }
  sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  f_2.exception = (Exception *)(sVar2 << 3);
  local_e8 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&f_2);
  kj::_::DebugExpression<unsigned_long>::operator>=
            ((DebugComparison<unsigned_long,_unsigned_int_&> *)local_e0,&local_e8,
             (uint *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
  if (bVar1) {
    __n = (ulong)(_kjCondition._32_4_ + 7 >> 3);
    __src = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
    memcpy(this->bits,__src,__n);
    memset(this->bits + __n,0,0x10 - __n);
    zeroIrrelevantBits(this);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&>
            ((Fault *)&byteCount,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0x4e,FAILED,"bits.size() * 8 >= bitCount","_kjCondition,",
             (DebugComparison<unsigned_long,_unsigned_int_&> *)local_e0);
  kj::_::Debug::Fault::fatal((Fault *)&byteCount);
}

Assistant:

CidrRange::CidrRange(int family, ArrayPtr<const byte> bits, uint bitCount)
    : family(family), bitCount(bitCount) {
  if (family == AF_INET) {
    KJ_REQUIRE(bitCount <= 32);
  } else {
    KJ_REQUIRE(bitCount <= 128);
  }
  KJ_REQUIRE(bits.size() * 8 >= bitCount);
  size_t byteCount = (bitCount + 7) / 8;
  memcpy(this->bits, bits.begin(), byteCount);
  memset(this->bits + byteCount, 0, sizeof(this->bits) - byteCount);

  zeroIrrelevantBits();
}